

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

pcp_errno parse_v2_map(pcp_recv_msg_t *f,void *r)

{
  ulong uVar1;
  size_t rest_size;
  pcp_map_v2_t *m;
  void *r_local;
  pcp_recv_msg_t *f_local;
  
  uVar1 = (ulong)f->pcp_msg_len - ((long)r - (long)f->pcp_msg_buffer);
  if (uVar1 < 0x24) {
    f_local._4_4_ = PCP_ERR_RECV_FAILED;
  }
  else {
    *(undefined8 *)(f->kd).nonce.n = *r;
    (f->kd).nonce.n[2] = *(uint32_t *)((long)r + 8);
    (f->kd).field_5.map_peer.src_port = *(uint16_t *)((long)r + 0x10);
    (f->kd).field_5.map_peer.protocol = *(uint8_t *)((long)r + 0xc);
    f->assigned_ext_port = *(uint16_t *)((long)r + 0x12);
    *(undefined8 *)&(f->assigned_ext_ip).__in6_u = *(undefined8 *)((long)r + 0x14);
    *(undefined8 *)((long)&(f->assigned_ext_ip).__in6_u + 8) = *(undefined8 *)((long)r + 0x1c);
    if (uVar1 < 0x25) {
      f_local._4_4_ = PCP_ERR_SUCCESS;
    }
    else {
      f_local._4_4_ = parse_options(f,(void *)((long)r + 0x24));
    }
  }
  return f_local._4_4_;
}

Assistant:

static pcp_errno parse_v2_map(pcp_recv_msg_t *f, void *r) {
    pcp_map_v2_t *m;
    size_t rest_size = f->pcp_msg_len - (((char *)r) - f->pcp_msg_buffer);

    if (rest_size < sizeof(pcp_map_v2_t)) {
        return PCP_ERR_RECV_FAILED;
    }

    m = (pcp_map_v2_t *)r;
    f->kd.nonce = m->nonce;
    f->kd.map_peer.src_port = m->int_port;
    f->kd.map_peer.protocol = m->protocol;
    f->assigned_ext_port = m->ext_port;
    memcpy(&f->assigned_ext_ip, m->ext_ip, sizeof(f->assigned_ext_ip));

    if (rest_size > sizeof(pcp_map_v2_t)) {
        return parse_options(f, m + 1);
    }
    return PCP_ERR_SUCCESS;
}